

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_geom_buf.cxx
# Opt level: O2

void __thiscall xray_re::xr_ibuf::xr_ibuf(xr_ibuf *this,xr_ibuf *that)

{
  size_t sVar1;
  undefined7 uVar2;
  unsigned_short *puVar3;
  
  (this->super_xr_flexbuf)._vptr_xr_flexbuf = (_func_int **)&PTR__xr_flexbuf_00238900;
  uVar2 = *(undefined7 *)&(that->super_xr_flexbuf).field_0x9;
  sVar1 = (that->super_xr_flexbuf).m_size;
  (this->super_xr_flexbuf).m_owner = (that->super_xr_flexbuf).m_owner;
  *(undefined7 *)&(this->super_xr_flexbuf).field_0x9 = uVar2;
  (this->super_xr_flexbuf).m_size = sVar1;
  (this->super_xr_flexbuf)._vptr_xr_flexbuf = (_func_int **)&PTR__xr_ibuf_00238878;
  (this->super_xr_flexbuf).m_owner = true;
  (this->super_xr_flexbuf).m_size = (that->super_xr_flexbuf).m_size;
  puVar3 = xr_flexbuf::duplicate<unsigned_short>(&this->super_xr_flexbuf,that->m_indices);
  this->m_indices = puVar3;
  return;
}

Assistant:

xr_ibuf::xr_ibuf(const xr_ibuf& that): xr_flexbuf(that)
{
	set_owner(true);
	set_size(that.size());
	m_indices = duplicate(that.m_indices);
}